

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::dimensions<18446744073709551615UL,_5UL,_18446744073709551615UL>::size
          (dimensions<18446744073709551615UL,_5UL,_18446744073709551615UL> *this)

{
  size_type sVar1;
  dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,3ul>
  local_11;
  dimensions<18446744073709551615UL,_5UL,_18446744073709551615UL> *local_10;
  dimensions<18446744073709551615UL,_5UL,_18446744073709551615UL> *this_local;
  
  local_10 = this;
  sVar1 = detail::
          dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,0ul,3ul>
          ::operator()(&local_11,
                       *(dimensions<18446744073709551615UL,_5UL,_18446744073709551615UL> *)
                        (this->dynamic_dims_)._M_elems);
  return sVar1;
}

Assistant:

inline constexpr typename dimensions<Dims...>::size_type
dimensions<Dims...>::size() const noexcept
{
    return detail::dims_unary_reduction<
        detail::identity_by_value
      , detail::multiplies_by_value
      , detail::static_sentinel<1>
      , 0
      , std::rank<dimensions>::value
    >()(*this);
}